

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6d54c::SharedLibraryShellCommand::getVerboseDescription
          (SharedLibraryShellCommand *this,SmallVectorImpl<char> *result)

{
  size_t in_RCX;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar2;
  StringRef Str;
  raw_svector_ostream stream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  raw_ostream local_58;
  SmallVectorImpl<char> *local_30;
  
  local_58.BufferMode = InternalBuffer;
  local_58.OutBufStart = (char *)0x0;
  local_58.OutBufEnd = (char *)0x0;
  local_58.OutBufCur = (char *)0x0;
  local_58._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_001e81c0;
  local_30 = result;
  llvm::raw_ostream::SetUnbuffered(&local_58);
  (anonymous_namespace)::SharedLibraryShellCommand::getArgs_abi_cxx11_(&local_70,this);
  if (local_70.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_70.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
    pbVar2 = local_70.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (bVar1) {
        bVar1 = false;
      }
      else {
        Str.Length = 1;
        Str.Data = " ";
        llvm::raw_ostream::operator<<(&local_58,Str);
      }
      llvm::raw_ostream::write
                (&local_58,(int)(pbVar2->_M_dataplus)._M_p,(void *)pbVar2->_M_string_length,in_RCX);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != local_70.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  llvm::raw_ostream::~raw_ostream(&local_58);
  return;
}

Assistant:

virtual void
  getVerboseDescription(SmallVectorImpl<char>& result) const override {
    llvm::raw_svector_ostream stream(result);
    bool first = true;
    for (const auto& arg : getArgs()) {
      if (first) {
        first = false;
      } else {
        stream << " ";
      }
      stream << arg;
    }
  }